

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material_palette.c
# Opt level: O3

bool_t prf_material_palette_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  bool_t bVar4;
  float32_t *pfVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  
  if (node->opcode == prf_material_palette_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    uVar2 = (uint)node->length;
    iVar6 = 4;
    if (7 < node->length) {
      pfVar5 = (float32_t *)node->data;
      bf_put_float32_be(bfile,*pfVar5);
      uVar2 = (uint)node->length;
      iVar6 = 8;
      if (0xb < node->length) {
        pfVar5 = pfVar5 + 1;
        iVar8 = 4;
        iVar3 = 0xc;
        do {
          bf_put_float32_be(bfile,*pfVar5);
          uVar2 = (uint)node->length;
          iVar6 = iVar3;
          if ((int)(uint)node->length < iVar8 + 0xc) break;
          bf_put_float32_be(bfile,pfVar5[1]);
          uVar2 = (uint)node->length;
          iVar6 = iVar8 + 0xc;
          if ((int)(uint)node->length < iVar8 + 0x10) break;
          bf_put_float32_be(bfile,pfVar5[2]);
          uVar2 = (uint)node->length;
          iVar6 = iVar8 + 0x10;
          if ((int)(uint)node->length < iVar8 + 0x14) break;
          bf_put_float32_be(bfile,pfVar5[3]);
          uVar2 = (uint)node->length;
          iVar6 = iVar8 + 0x14;
          if ((int)(uint)node->length < iVar8 + 0x18) break;
          bf_put_float32_be(bfile,pfVar5[4]);
          uVar2 = (uint)node->length;
          iVar6 = iVar8 + 0x18;
          if ((int)(uint)node->length < iVar8 + 0x1c) break;
          bf_put_float32_be(bfile,pfVar5[5]);
          uVar2 = (uint)node->length;
          iVar6 = iVar8 + 0x1c;
          if ((int)(uint)node->length < iVar8 + 0x20) break;
          bf_put_float32_be(bfile,pfVar5[6]);
          uVar2 = (uint)node->length;
          iVar6 = iVar8 + 0x20;
          if ((int)(uint)node->length < iVar8 + 0x24) break;
          bf_put_float32_be(bfile,pfVar5[7]);
          uVar2 = (uint)node->length;
          iVar6 = iVar8 + 0x24;
          if ((int)(uint)node->length < iVar8 + 0x28) break;
          bf_put_float32_be(bfile,pfVar5[8]);
          uVar2 = (uint)node->length;
          iVar6 = iVar8 + 0x28;
          if ((int)(uint)node->length < iVar8 + 0x2c) break;
          bf_put_float32_be(bfile,pfVar5[9]);
          uVar2 = (uint)node->length;
          iVar6 = iVar8 + 0x2c;
          if ((int)(uint)node->length < iVar8 + 0x30) break;
          bf_put_float32_be(bfile,pfVar5[10]);
          uVar2 = (uint)node->length;
          iVar6 = iVar8 + 0x30;
          if ((int)(uint)node->length < iVar8 + 0x34) break;
          bf_put_float32_be(bfile,pfVar5[0xb]);
          uVar2 = (uint)node->length;
          iVar6 = iVar8 + 0x34;
          if ((int)(uint)node->length < iVar8 + 0x38) break;
          bf_put_float32_be(bfile,pfVar5[0xc]);
          uVar2 = (uint)node->length;
          iVar6 = iVar8 + 0x38;
          if ((int)(uint)node->length < iVar8 + 0x3c) break;
          bf_put_uint32_be(bfile,(uint32_t)pfVar5[0xd]);
          uVar2 = (uint)node->length;
          iVar6 = iVar8 + 0x3c;
          if ((int)(uint)node->length < iVar8 + 0x40) break;
          bf_write(bfile,(uint8_t *)(pfVar5 + 0xe),0xc);
          lVar7 = 0;
          iVar6 = iVar8 + 0x48;
          do {
            uVar1 = node->length;
            if ((int)(uint)uVar1 < iVar6 + 4) {
              iVar9 = iVar6 + 4;
              iVar8 = iVar6;
              goto LAB_00108a7e;
            }
            bf_put_uint32_be(bfile,(uint32_t)pfVar5[lVar7 + 0x11]);
            lVar7 = lVar7 + 1;
            iVar6 = iVar6 + 4;
          } while (lVar7 != 0x1c);
          uVar1 = node->length;
          iVar9 = iVar8 + 0xbc;
          iVar8 = iVar8 + 0xb8;
LAB_00108a7e:
          uVar2 = (uint)uVar1;
          iVar6 = iVar8;
          if ((int)(uint)uVar1 < iVar9) break;
          pfVar5 = (float32_t *)(node->data + iVar8);
          bf_put_float32_be(bfile,*(float32_t *)(node->data + (long)iVar8 + -4));
          uVar2 = (uint)node->length;
          iVar3 = iVar8 + 8;
          iVar6 = iVar9;
        } while (iVar3 <= (int)(uint)node->length);
      }
    }
    bVar4 = 1;
    if (uVar2 - iVar6 != 0 && iVar6 <= (int)uVar2) {
      bf_write(bfile,node->data + (long)iVar6 + -4,uVar2 - iVar6);
    }
  }
  else {
    bVar4 = 0;
    prf_error(9,"tried material palette save method on node of type %d.");
  }
  return bVar4;
}

Assistant:

static
bool_t
prf_material_palette_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;
    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_material_palette_info.opcode ) {
        prf_error( 9, "tried material palette save method on node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        int i;
        data = (node_data *) (node->data + pos - 4);
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->ambient_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->ambient_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->ambient_blue ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->diffuse_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->diffuse_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->diffuse_blue ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->specular_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->specular_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->specular_blue ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->emissive_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->emissive_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->emissive_blue ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->shininess ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->alpha ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->flags ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_write( bfile, (uint8_t *) data->name, 12 ); pos += 12;
        for ( i = 0; i < 28 && node->length >= (pos + 4); i++ ) {
            bf_put_uint32_be( bfile, data->reserved1[i] ); pos += 4;
        }
    } while ( TRUE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}